

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sqlite3 *db;
  sqlite3 *psVar3;
  Vdbe *p;
  Parse *pPVar4;
  int *piVar5;
  VdbeOp *pVVar6;
  u8 uVar7;
  int iVar8;
  uint dest;
  TriggerPrg *pTVar9;
  SubProgram *pSVar10;
  Parse *pParse_00;
  Vdbe *pVVar11;
  char *zP4;
  Expr *pEVar12;
  SrcList *pSVar13;
  ExprList *pChanges;
  IdList *pColumn;
  Select *pSVar14;
  Parse *pPVar15;
  TriggerStep *pStep;
  SelectDest local_80;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  pPVar15 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar15 = pParse;
  }
  pTVar9 = pPVar15->pTriggerPrg;
  while( true ) {
    if (pTVar9 == (TriggerPrg *)0x0) {
      db = pParse->db;
      pTVar9 = (TriggerPrg *)sqlite3DbMallocRaw(db,0x28);
      if (pTVar9 != (TriggerPrg *)0x0) {
        pTVar9->pProgram = (SubProgram *)0x0;
        pTVar9->orconf = 0;
        pTVar9->aColmask[0] = 0;
        pTVar9->pTrigger = (Trigger *)0x0;
        pTVar9->pNext = (TriggerPrg *)0x0;
        *(undefined8 *)(pTVar9->aColmask + 1) = 0;
        pTVar9->pNext = pPVar15->pTriggerPrg;
        pPVar15->pTriggerPrg = pTVar9;
        pSVar10 = (SubProgram *)sqlite3DbMallocRaw(db,0x28);
        if (pSVar10 == (SubProgram *)0x0) {
          pTVar9->pProgram = (SubProgram *)0x0;
        }
        else {
          pSVar10->nCsr = 0;
          pSVar10->nOnce = 0;
          pSVar10->token = (void *)0x0;
          pSVar10->aOp = (VdbeOp *)0x0;
          pSVar10->nOp = 0;
          pSVar10->nMem = 0;
          pSVar10->pNext = (SubProgram *)0x0;
          pTVar9->pProgram = pSVar10;
          pVVar11 = pPVar15->pVdbe;
          pSVar10->pNext = pVVar11->pProgram;
          pVVar11->pProgram = pSVar10;
          pTVar9->pTrigger = pTrigger;
          pTVar9->orconf = orconf;
          pTVar9->aColmask[0] = 0xffffffff;
          pTVar9->aColmask[1] = 0xffffffff;
          pParse_00 = (Parse *)sqlite3DbMallocRaw(db,0x288);
          if (pParse_00 != (Parse *)0x0) {
            dest = 0;
            memset(pParse_00,0,0x288);
            local_58 = (undefined1  [16])0x0;
            local_48 = (undefined1  [16])0x0;
            local_38._0_2_ = 0;
            local_38._2_6_ = 0;
            local_68._8_8_ = 0;
            local_68._0_8_ = pParse_00;
            pParse_00->db = db;
            pParse_00->pTriggerTab = pTab;
            pParse_00->pToplevel = pPVar15;
            pParse_00->zAuthContext = pTrigger->zName;
            pParse_00->eTriggerOp = pTrigger->op;
            pParse_00->nQueryLoop = pParse->nQueryLoop;
            pVVar11 = sqlite3GetVdbe(pParse_00);
            if (pVVar11 != (Vdbe *)0x0) {
              zP4 = sqlite3MPrintf(db,"-- TRIGGER %s",pTrigger->zName);
              sqlite3VdbeChangeP4(pVVar11,-1,zP4,-1);
              if (pTrigger->pWhen != (Expr *)0x0) {
                dest = 0;
                pEVar12 = exprDup(db,pTrigger->pWhen,0,(u8 **)0x0);
                iVar8 = sqlite3ResolveExprNames((NameContext *)local_68,pEVar12);
                if ((iVar8 == 0) && (db->mallocFailed == '\0')) {
                  dest = sqlite3VdbeMakeLabel(pVVar11);
                  sqlite3ExprIfFalse(pParse_00,pEVar12,dest,0x10);
                }
                sqlite3ExprDelete(db,pEVar12);
              }
              pStep = pTrigger->step_list;
              if (pStep != (TriggerStep *)0x0) {
                psVar3 = pParse_00->db;
                p = pParse_00->pVdbe;
                do {
                  uVar7 = (u8)orconf;
                  if (orconf == 10) {
                    uVar7 = pStep->orconf;
                  }
                  pParse_00->eOrconf = uVar7;
                  uVar7 = pStep->op;
                  if (uVar7 == 'l') {
                    pSVar13 = targetSrcList(pParse_00,pStep);
                    pSVar14 = sqlite3SelectDup(psVar3,pStep->pSelect,0);
                    pColumn = sqlite3IdListDup(psVar3,pStep->pIdList);
                    sqlite3Insert(pParse_00,pSVar13,pSVar14,pColumn,(uint)pParse_00->eOrconf);
                  }
                  else if (uVar7 == 'm') {
                    pSVar13 = targetSrcList(pParse_00,pStep);
                    pEVar12 = exprDup(psVar3,pStep->pWhere,0,(u8 **)0x0);
                    sqlite3DeleteFrom(pParse_00,pSVar13,pEVar12);
                  }
                  else if (uVar7 == 'n') {
                    pSVar13 = targetSrcList(pParse_00,pStep);
                    pChanges = sqlite3ExprListDup(psVar3,pStep->pExprList,0);
                    pEVar12 = exprDup(psVar3,pStep->pWhere,0,(u8 **)0x0);
                    sqlite3Update(pParse_00,pSVar13,pChanges,pEVar12,(uint)pParse_00->eOrconf);
                  }
                  else {
                    pSVar14 = sqlite3SelectDup(psVar3,pStep->pSelect,0);
                    local_80.eDest = '\x04';
                    local_80.affSdst = '\0';
                    local_80.iSDParm = 0;
                    local_80.iSdst = 0;
                    local_80.nSdst = 0;
                    sqlite3Select(pParse_00,pSVar14,&local_80);
                    clearSelect(psVar3,pSVar14,1);
                  }
                  if (pStep->op != 'w') {
                    sqlite3VdbeAddOp3(p,0x62,0,0,0);
                  }
                  pStep = pStep->pNext;
                } while (pStep != (TriggerStep *)0x0);
              }
              if (dest != 0) {
                pPVar4 = pVVar11->pParse;
                if (((int)dest < 0) && (piVar5 = pPVar4->aLabel, piVar5 != (int *)0x0)) {
                  piVar5[~dest] = pVVar11->nOp;
                }
                pPVar4->iFixedOp = pVVar11->nOp + -1;
              }
              sqlite3VdbeAddOp3(pVVar11,0x18,0,0,0);
              if (pParse->nErr == 0) {
                pParse->zErrMsg = pParse_00->zErrMsg;
                pParse->nErr = pParse_00->nErr;
              }
              else {
                sqlite3DbFree(pParse_00->db,pParse_00->zErrMsg);
              }
              if (db->mallocFailed == '\0') {
                pVVar6 = pVVar11->aOp;
                resolveP2Values(pVVar11,&pPVar15->nMaxArg);
                pSVar10->nOp = pVVar11->nOp;
                pVVar11->aOp = (Op *)0x0;
                pSVar10->aOp = pVVar6;
              }
              uVar1 = pParse_00->nTab;
              uVar2 = pParse_00->nMem;
              pSVar10->nMem = uVar2;
              pSVar10->nCsr = uVar1;
              pSVar10->nOnce = pParse_00->nOnce;
              pSVar10->token = pTrigger;
              pTVar9->aColmask[0] = pParse_00->oldmask;
              pTVar9->aColmask[1] = pParse_00->newmask;
              sqlite3VdbeDelete(pVVar11);
            }
            psVar3 = pParse_00->db;
            sqlite3DbFree(psVar3,pParse_00->aLabel);
            sqlite3ExprListDelete(psVar3,pParse_00->pConstExpr);
            sqlite3DbFree(db,pParse_00);
            return pTVar9;
          }
        }
      }
      return (TriggerPrg *)0x0;
    }
    if ((pTVar9->pTrigger == pTrigger) && (pTVar9->orconf == orconf)) break;
    pTVar9 = pTVar9->pNext;
  }
  return pTVar9;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg; 
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf); 
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
  }

  return pPrg;
}